

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O2

bool __thiscall
cmProjectCommand::InitialPass
          (cmProjectCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  code *pcVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  PolicyStatus PVar11;
  int iVar12;
  string *psVar13;
  char *pcVar14;
  ostream *poVar15;
  PolicyID id;
  ulong uVar16;
  long lVar17;
  cmProjectCommand *pcVar18;
  string *i;
  _Alloc_hider name;
  string *__lhs;
  allocator<char> local_409;
  cmProjectCommand *local_408;
  string *local_400;
  string vv;
  _Any_data local_3d8;
  code *local_3c8;
  code *pcStack_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  anon_class_8_1_0e9793f7 resetReporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string vs;
  string msg;
  char local_2f8 [64];
  char local_2b8 [64];
  char local_278 [192];
  uint v [4];
  string homepage;
  string description;
  string version;
  string srcdir;
  string bindir;
  RegularExpression vx;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"PROJECT called with incorrect number of arguments",
               (allocator<char> *)&vx);
    cmCommand::SetError(&this->super_cmCommand,&msg);
    std::__cxx11::string::~string((string *)&msg);
    return false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,"CMAKE_PROJECT_INCLUDE_BEFORE",(allocator<char> *)&vx);
  bVar7 = IncludeByVariable(this,&msg);
  std::__cxx11::string::~string((string *)&msg);
  if (!bVar7) {
    return false;
  }
  psVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  cmMakefile::SetProjectName((this->super_cmCommand).Makefile,psVar13);
  std::__cxx11::string::string((string *)&bindir,(string *)psVar13);
  std::__cxx11::string::append((char *)&bindir);
  local_400 = psVar13;
  std::__cxx11::string::string((string *)&srcdir,(string *)psVar13);
  std::__cxx11::string::append((char *)&srcdir);
  pcVar1 = (this->super_cmCommand).Makefile;
  psVar13 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
  cmMakefile::AddCacheDefinition
            (pcVar1,&bindir,(psVar13->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,false);
  pcVar1 = (this->super_cmCommand).Makefile;
  psVar13 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar1);
  cmMakefile::AddCacheDefinition
            (pcVar1,&srcdir,(psVar13->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,false);
  std::__cxx11::string::assign((char *)&bindir);
  std::__cxx11::string::assign((char *)&srcdir);
  pcVar1 = (this->super_cmCommand).Makefile;
  psVar13 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar1);
  cmMakefile::AddDefinition(pcVar1,&bindir,(psVar13->_M_dataplus)._M_p);
  pcVar1 = (this->super_cmCommand).Makefile;
  psVar13 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar1);
  cmMakefile::AddDefinition(pcVar1,&srcdir,(psVar13->_M_dataplus)._M_p);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,"PROJECT_NAME",(allocator<char> *)&vx);
  cmMakefile::AddDefinition(pcVar1,&msg,(local_400->_M_dataplus)._M_p);
  std::__cxx11::string::~string((string *)&msg);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msg,"CMAKE_PROJECT_NAME",(allocator<char> *)&vx);
  pcVar14 = cmMakefile::GetDefinition(pcVar1,&msg);
  if (pcVar14 == (char *)0x0) {
    std::__cxx11::string::~string((string *)&msg);
LAB_001cc480:
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"CMAKE_PROJECT_NAME",(allocator<char> *)&vx);
    cmMakefile::AddDefinition(pcVar1,&msg,(local_400->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&msg);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"CMAKE_PROJECT_NAME",(allocator<char> *)&vx);
    cmMakefile::AddCacheDefinition
              (pcVar1,&msg,(local_400->_M_dataplus)._M_p,"Value Computed by CMake",STATIC,false);
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    bVar7 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
    std::__cxx11::string::~string((string *)&msg);
    if (bVar7) goto LAB_001cc480;
  }
  version._M_dataplus._M_p = (pointer)&version.field_2;
  version._M_string_length = 0;
  description._M_dataplus._M_p = (pointer)&description.field_2;
  description._M_string_length = 0;
  homepage._M_dataplus._M_p = (pointer)&homepage.field_2;
  homepage._M_string_length = 0;
  version.field_2._M_local_buf[0] = '\0';
  description.field_2._M_local_buf[0] = '\0';
  bVar3 = false;
  homepage.field_2._M_local_buf[0] = '\0';
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  resetReporter.missedValueReporter = (function<void_()> *)&local_3d8;
  local_3c8 = (code *)0x0;
  pcStack_3c0 = (code *)0x0;
  local_3d8._M_unused._M_object = (cmProjectCommand *)0x0;
  local_3d8._8_8_ = (anon_class_8_1_0e9793f7 *)0x0;
  iVar12 = 2;
  lVar17 = 0x20;
  psVar13 = &msg;
  bVar4 = false;
  bVar9 = false;
  bVar7 = false;
  bVar10 = false;
  local_408 = this;
  for (uVar16 = 1; __lhs = local_400, pcVar18 = local_408,
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar16 = uVar16 + 1) {
    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar2->_M_dataplus)._M_p + lVar17),"LANGUAGES");
    if (bVar8) {
      if (bVar7) {
        pcVar1 = (local_408->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"LANGUAGES may be specified at most once.",(allocator<char> *)&vx)
        ;
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&msg);
        goto LAB_001cd54f;
      }
      if (local_3c8 != (code *)0x0) {
        std::function<void_()>::operator()((function<void_()> *)&local_3d8);
      }
      bVar7 = true;
      if (languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)psVar13,
                   "the following parameters must be specified after LANGUAGES keyword: ",
                   (allocator<char> *)&vx);
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)&vx,&languages,", ");
        std::__cxx11::string::append((string *)psVar13);
        std::__cxx11::string::~string((string *)&vx);
        std::__cxx11::string::push_back((char)psVar13);
        cmMakefile::IssueMessage((local_408->super_cmCommand).Makefile,WARNING,psVar13);
        std::__cxx11::string::~string((string *)psVar13);
      }
LAB_001cc694:
      iVar12 = 2;
    }
    else {
      bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar17),"VERSION");
      if (bVar8) {
        if (bVar10) {
          pcVar1 = (local_408->super_cmCommand).Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"VERSION may be specified at most once.",(allocator<char> *)&vx)
          ;
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&msg);
          goto LAB_001cd54f;
        }
        if (local_3c8 == (code *)0x0) {
          msg.field_2._M_allocated_capacity = (size_type)(code *)0x0;
        }
        else {
          std::function<void_()>::operator()((function<void_()> *)&local_3d8);
          msg.field_2._M_allocated_capacity = (size_type)local_3c8;
        }
        msg._M_dataplus._M_p = (pointer)local_3d8._M_unused._0_8_;
        msg._M_string_length = local_3d8._8_8_;
        local_3d8._M_unused._M_function_pointer = (_func_void *)local_408;
        local_3d8._8_8_ = &resetReporter;
        local_3c8 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:127:29)>
                    ::_M_manager;
        msg.field_2._8_8_ = pcStack_3c0;
        pcStack_3c0 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:127:29)>
                      ::_M_invoke;
        std::_Function_base::~_Function_base((_Function_base *)psVar13);
        bVar10 = true;
        iVar12 = 3;
      }
      else {
        bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&(((args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + lVar17),"DESCRIPTION");
        if (bVar8) {
          if (bVar3) {
            pcVar1 = (local_408->super_cmCommand).Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&msg,"DESCRIPTION may be specified at most once.",
                       (allocator<char> *)&vx);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&msg);
            goto LAB_001cd54f;
          }
          if (local_3c8 == (code *)0x0) {
            msg.field_2._M_allocated_capacity = (size_type)(code *)0x0;
          }
          else {
            std::function<void_()>::operator()((function<void_()> *)&local_3d8);
            msg.field_2._M_allocated_capacity = (size_type)local_3c8;
          }
          msg._M_dataplus._M_p = (pointer)local_3d8._M_unused._0_8_;
          msg._M_string_length = local_3d8._8_8_;
          local_3d8._M_unused._M_function_pointer = (_func_void *)local_408;
          local_3d8._8_8_ = &resetReporter;
          local_3c8 = std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:147:29)>
                      ::_M_manager;
          msg.field_2._8_8_ = pcStack_3c0;
          pcStack_3c0 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:147:29)>
                        ::_M_invoke;
          std::_Function_base::~_Function_base((_Function_base *)psVar13);
          iVar12 = 0;
          bVar3 = true;
        }
        else {
          bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&(((args->
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             _M_dataplus)._M_p + lVar17),"HOMEPAGE_URL");
          pcVar6 = local_3c8;
          if (bVar8) {
            if (bVar4) {
              pcVar1 = (local_408->super_cmCommand).Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&msg,"HOMEPAGE_URL may be specified at most once.",
                         (allocator<char> *)&vx);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&msg);
              goto LAB_001cd54f;
            }
            msg._M_dataplus._M_p = (pointer)local_3d8._M_unused._0_8_;
            msg._M_string_length = local_3d8._8_8_;
            local_3d8._M_unused._M_function_pointer = (_func_void *)local_408;
            local_3d8._8_8_ = &resetReporter;
            local_3c8 = std::
                        _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:164:29)>
                        ::_M_manager;
            msg.field_2._M_allocated_capacity = (size_type)pcVar6;
            msg.field_2._8_8_ = pcStack_3c0;
            pcStack_3c0 = std::
                          _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmProjectCommand.cxx:164:29)>
                          ::_M_invoke;
            std::_Function_base::~_Function_base((_Function_base *)psVar13);
            bVar4 = true;
            iVar12 = 1;
          }
          else {
            if ((uVar16 != 1) ||
               (bVar8 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 1,
                                        "__CMAKE_INJECTED_PROJECT_COMMAND__"), !bVar8)) {
              if (iVar12 == 0) {
                std::__cxx11::string::_M_assign((string *)&description);
              }
              else if (iVar12 == 1) {
                std::__cxx11::string::_M_assign((string *)&homepage);
              }
              else {
                if (iVar12 != 3) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&languages,
                              (value_type *)
                              ((long)&(((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar17));
                  iVar12 = 2;
                  goto LAB_001cc813;
                }
                std::__cxx11::string::_M_assign((string *)&version);
              }
              InitialPass::anon_class_8_1_0e9793f7::operator()(&resetReporter);
              goto LAB_001cc694;
            }
            bVar9 = true;
          }
        }
      }
    }
LAB_001cc813:
    lVar17 = lVar17 + 0x20;
  }
  if (local_3c8 != (code *)0x0) {
    std::function<void_()>::operator()((function<void_()> *)&local_3d8);
  }
  if (((bVar10) || (bVar3)) || (bVar4)) {
    if (bVar7) goto LAB_001cc976;
    if (languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001cca73;
    pcVar1 = (pcVar18->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,
               "project with VERSION, DESCRIPTION or HOMEPAGE_URL must use LANGUAGES before language names."
               ,(allocator<char> *)&vx);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&msg);
LAB_001cd54f:
    std::__cxx11::string::~string((string *)&msg);
    cmSystemTools::s_FatalErrorOccured = true;
    bVar7 = true;
  }
  else {
    if (bVar7) {
LAB_001cc976:
      if (languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[5]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,
                   (char (*) [5])0x4659f1);
      }
    }
LAB_001cca73:
    PVar11 = cmMakefile::GetPolicyStatus((pcVar18->super_cmCommand).Makefile,CMP0048,false);
    if (bVar10) {
      if (PVar11 < NEW) {
        pcVar1 = (pcVar18->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msg,"VERSION not allowed unless CMP0048 is set to NEW",
                   (allocator<char> *)&vx);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&msg);
        goto LAB_001cd54f;
      }
      cmsys::RegularExpression::RegularExpression
                (&vx,"^([0-9]+(\\.[0-9]+(\\.[0-9]+(\\.[0-9]+)?)?)?)?$");
      bVar10 = cmsys::RegularExpression::find(&vx,version._M_dataplus._M_p);
      if (bVar10) {
        vs._M_dataplus._M_p = (pointer)&vs.field_2;
        vs._M_string_length = 0;
        vs.field_2._M_local_buf[0] = '\0';
        v[0] = 0;
        v[1] = 0;
        v[2] = 0;
        v[3] = 0;
        iVar12 = __isoc99_sscanf(version._M_dataplus._M_p,"%u.%u.%u.%u",v,v + 1,v + 2,v + 3);
        for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
          if (lVar17 < iVar12) {
            sprintf((char *)psVar13,"%u",(ulong)v[lVar17]);
            std::__cxx11::string::append((char *)&vs);
            std::__cxx11::string::append((char *)&vs);
          }
          else {
            *(undefined1 *)&(psVar13->_M_dataplus)._M_p = 0;
          }
          psVar13 = psVar13 + 2;
        }
        vv._M_dataplus._M_p = (pointer)&vv.field_2;
        vv._M_string_length = 0;
        vv.field_2._M_allocated_capacity = vv.field_2._M_allocated_capacity & 0xffffffffffffff00;
        std::operator+(&local_3b8,local_400,"_VERSION");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        pcVar18 = local_408;
        pcVar1 = (local_408->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b8,"PROJECT_VERSION",&local_409);
        cmMakefile::AddDefinition(pcVar1,&local_3b8,vs._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_3b8);
        cmMakefile::AddDefinition((pcVar18->super_cmCommand).Makefile,&vv,vs._M_dataplus._M_p);
        std::operator+(&local_3b8,local_400,"_VERSION_MAJOR");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        pcVar1 = (pcVar18->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b8,"PROJECT_VERSION_MAJOR",&local_409);
        cmMakefile::AddDefinition(pcVar1,&local_3b8,(char *)&msg);
        std::__cxx11::string::~string((string *)&local_3b8);
        cmMakefile::AddDefinition((pcVar18->super_cmCommand).Makefile,&vv,(char *)&msg);
        std::operator+(&local_3b8,local_400,"_VERSION_MINOR");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        pcVar1 = (pcVar18->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b8,"PROJECT_VERSION_MINOR",&local_409);
        cmMakefile::AddDefinition(pcVar1,&local_3b8,local_2f8);
        std::__cxx11::string::~string((string *)&local_3b8);
        cmMakefile::AddDefinition((pcVar18->super_cmCommand).Makefile,&vv,local_2f8);
        std::operator+(&local_3b8,local_400,"_VERSION_PATCH");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        pcVar1 = (pcVar18->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b8,"PROJECT_VERSION_PATCH",&local_409);
        cmMakefile::AddDefinition(pcVar1,&local_3b8,local_2b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        cmMakefile::AddDefinition((pcVar18->super_cmCommand).Makefile,&vv,local_2b8);
        std::operator+(&local_3b8,local_400,"_VERSION_TWEAK");
        std::__cxx11::string::operator=((string *)&vv,(string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3b8);
        pcVar1 = (pcVar18->super_cmCommand).Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3b8,"PROJECT_VERSION_TWEAK",&local_409);
        cmMakefile::AddDefinition(pcVar1,&local_3b8,local_278);
        std::__cxx11::string::~string((string *)&local_3b8);
        pcVar18 = local_408;
        cmMakefile::AddDefinition((local_408->super_cmCommand).Makefile,&vv,local_278);
        TopLevelCMakeVarCondSet(pcVar18,"CMAKE_PROJECT_VERSION",vs._M_dataplus._M_p);
        TopLevelCMakeVarCondSet(pcVar18,"CMAKE_PROJECT_VERSION_MAJOR",(char *)&msg);
        TopLevelCMakeVarCondSet(pcVar18,"CMAKE_PROJECT_VERSION_MINOR",local_2f8);
        TopLevelCMakeVarCondSet(pcVar18,"CMAKE_PROJECT_VERSION_PATCH",local_2b8);
        TopLevelCMakeVarCondSet(pcVar18,"CMAKE_PROJECT_VERSION_TWEAK",local_278);
        std::__cxx11::string::~string((string *)&vv);
        std::__cxx11::string::~string((string *)&vs);
        __lhs = local_400;
      }
      else {
        std::operator+(&vs,"VERSION \"",&version);
        std::operator+(&msg,&vs,"\" format invalid.");
        std::__cxx11::string::~string((string *)&vs);
        cmMakefile::IssueMessage((pcVar18->super_cmCommand).Makefile,FATAL_ERROR,&msg);
        cmSystemTools::s_FatalErrorOccured = true;
        std::__cxx11::string::~string((string *)&msg);
      }
      cmsys::RegularExpression::~RegularExpression(&vx);
      bVar7 = true;
      if (!bVar10) goto LAB_001cd569;
    }
    else if (PVar11 != OLD) {
      vv._M_dataplus._M_p = (pointer)0x0;
      vv._M_string_length = 0;
      vv.field_2._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[16]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 (char (*) [16])0x4208a0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[22]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 (char (*) [22])0x4208b6);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[22]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 (char (*) [22])0x4208d2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[22]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 (char (*) [22])0x4208ee);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[22]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                 (char (*) [22])0x42090a);
      std::operator+(&msg,__lhs,"_VERSION");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::operator+(&msg,__lhs,"_VERSION_MAJOR");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::operator+(&msg,__lhs,"_VERSION_MINOR");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::operator+(&msg,__lhs,"_VERSION_PATCH");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::operator+(&msg,__lhs,"_VERSION_TWEAK");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,&msg);
      std::__cxx11::string::~string((string *)&msg);
      bVar7 = cmMakefile::IsRootMakefile((pcVar18->super_cmCommand).Makefile);
      if (bVar7) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[22]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                   (char (*) [22])"CMAKE_PROJECT_VERSION");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_MAJOR");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_MINOR");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_PATCH");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[28]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vv,
                   (char (*) [28])"CMAKE_PROJECT_VERSION_TWEAK");
      }
      sVar5 = vv._M_string_length;
      vx.regmatch.startp[0] = (char *)(vx.regmatch.startp + 2);
      vx.regmatch.startp[1] = (char *)0x0;
      vx.regmatch.startp[2]._0_1_ = 0;
      for (name._M_p = vv._M_dataplus._M_p; __lhs = local_400, pcVar18 = local_408,
          name._M_p != (pointer)sVar5; name._M_p = name._M_p + 0x20) {
        pcVar14 = cmMakefile::GetDefinition
                            ((local_408->super_cmCommand).Makefile,(string *)name._M_p);
        if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
          if (PVar11 == WARN) {
            if (!bVar9) {
              std::__cxx11::string::append((char *)&vx);
              std::__cxx11::string::append((string *)&vx);
            }
          }
          else {
            cmMakefile::AddDefinition((local_408->super_cmCommand).Makefile,(string *)name._M_p,"");
          }
        }
      }
      if (vx.regmatch.startp[1] != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&vs,(cmPolicies *)0x30,id);
        poVar15 = std::operator<<((ostream *)&msg,(string *)&vs);
        poVar15 = std::operator<<(poVar15,"\nThe following variable(s) would be set to empty:");
        std::operator<<(poVar15,(string *)&vx);
        std::__cxx11::string::~string((string *)&vs);
        pcVar1 = (pcVar18->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&vs);
        std::__cxx11::string::~string((string *)&vs);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
      }
      std::__cxx11::string::~string((string *)&vx);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vv);
    }
    pcVar1 = (pcVar18->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"PROJECT_DESCRIPTION",(allocator<char> *)&vx);
    cmMakefile::AddDefinition(pcVar1,&msg,description._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&msg);
    pcVar1 = (pcVar18->super_cmCommand).Makefile;
    std::operator+(&msg,__lhs,"_DESCRIPTION");
    cmMakefile::AddDefinition(pcVar1,&msg,description._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&msg);
    TopLevelCMakeVarCondSet(pcVar18,"CMAKE_PROJECT_DESCRIPTION",description._M_dataplus._M_p);
    pcVar1 = (pcVar18->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"PROJECT_HOMEPAGE_URL",(allocator<char> *)&vx);
    cmMakefile::AddDefinition(pcVar1,&msg,homepage._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&msg);
    pcVar1 = (pcVar18->super_cmCommand).Makefile;
    std::operator+(&msg,__lhs,"_HOMEPAGE_URL");
    cmMakefile::AddDefinition(pcVar1,&msg,homepage._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&msg);
    TopLevelCMakeVarCondSet(pcVar18,"CMAKE_PROJECT_HOMEPAGE_URL",homepage._M_dataplus._M_p);
    if (languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        languages.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[2]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,
                 (char (*) [2])0x413fb7);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[4]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&languages,
                 (char (*) [4])0x431cea);
    }
    cmMakefile::EnableLanguage((pcVar18->super_cmCommand).Makefile,&languages,false);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"CMAKE_PROJECT_INCLUDE",(allocator<char> *)&vx);
    bVar7 = IncludeByVariable(pcVar18,&msg);
    std::__cxx11::string::~string((string *)&msg);
    if (bVar7) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,
                     "CMAKE_PROJECT_",__lhs);
      std::operator+(&msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vx,
                     "_INCLUDE");
      bVar7 = IncludeByVariable(pcVar18,&msg);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::string::~string((string *)&vx);
    }
    else {
      bVar7 = false;
    }
  }
LAB_001cd569:
  std::_Function_base::~_Function_base((_Function_base *)&local_3d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&languages);
  std::__cxx11::string::~string((string *)&homepage);
  std::__cxx11::string::~string((string *)&description);
  std::__cxx11::string::~string((string *)&version);
  std::__cxx11::string::~string((string *)&srcdir);
  std::__cxx11::string::~string((string *)&bindir);
  return bVar7;
}

Assistant:

bool cmProjectCommand::InitialPass(std::vector<std::string> const& args,
                                   cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("PROJECT called with incorrect number of arguments");
    return false;
  }

  if (!this->IncludeByVariable("CMAKE_PROJECT_INCLUDE_BEFORE")) {
    return false;
  }

  std::string const& projectName = args[0];

  this->Makefile->SetProjectName(projectName);

  std::string bindir = projectName;
  bindir += "_BINARY_DIR";
  std::string srcdir = projectName;
  srcdir += "_SOURCE_DIR";

  this->Makefile->AddCacheDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);
  this->Makefile->AddCacheDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str(),
    "Value Computed by CMake", cmStateEnums::STATIC);

  bindir = "PROJECT_BINARY_DIR";
  srcdir = "PROJECT_SOURCE_DIR";

  this->Makefile->AddDefinition(
    bindir, this->Makefile->GetCurrentBinaryDirectory().c_str());
  this->Makefile->AddDefinition(
    srcdir, this->Makefile->GetCurrentSourceDirectory().c_str());

  this->Makefile->AddDefinition("PROJECT_NAME", projectName.c_str());

  // Set the CMAKE_PROJECT_NAME variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one, so that
  // CMAKE_PROJECT_NAME will match PROJECT_NAME, and cmake --build
  // will work.
  if (!this->Makefile->GetDefinition("CMAKE_PROJECT_NAME") ||
      (this->Makefile->IsRootMakefile())) {
    this->Makefile->AddDefinition("CMAKE_PROJECT_NAME", projectName.c_str());
    this->Makefile->AddCacheDefinition(
      "CMAKE_PROJECT_NAME", projectName.c_str(), "Value Computed by CMake",
      cmStateEnums::STATIC);
  }

  bool haveVersion = false;
  bool haveLanguages = false;
  bool haveDescription = false;
  bool haveHomepage = false;
  bool injectedProjectCommand = false;
  std::string version;
  std::string description;
  std::string homepage;
  std::vector<std::string> languages;
  std::function<void()> missedValueReporter;
  auto resetReporter = [&missedValueReporter]() {
    missedValueReporter = std::function<void()>();
  };
  enum Doing
  {
    DoingDescription,
    DoingHomepage,
    DoingLanguages,
    DoingVersion
  };
  Doing doing = DoingLanguages;
  for (size_t i = 1; i < args.size(); ++i) {
    if (args[i] == "LANGUAGES") {
      if (haveLanguages) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "LANGUAGES may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveLanguages = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingLanguages;
      if (!languages.empty()) {
        std::string msg =
          "the following parameters must be specified after LANGUAGES "
          "keyword: ";
        msg += cmJoin(languages, ", ");
        msg += '.';
        this->Makefile->IssueMessage(MessageType::WARNING, msg);
      }
    } else if (args[i] == "VERSION") {
      if (haveVersion) {
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                     "VERSION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveVersion = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingVersion;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "VERSION keyword not followed by a value or was followed by a "
          "value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "DESCRIPTION") {
      if (haveDescription) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "DESCRIPTION may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveDescription = true;
      if (missedValueReporter) {
        missedValueReporter();
      }
      doing = DoingDescription;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "DESCRIPTION keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (args[i] == "HOMEPAGE_URL") {
      if (haveHomepage) {
        this->Makefile->IssueMessage(
          MessageType::FATAL_ERROR,
          "HOMEPAGE_URL may be specified at most once.");
        cmSystemTools::SetFatalErrorOccured();
        return true;
      }
      haveHomepage = true;
      doing = DoingHomepage;
      missedValueReporter = [this, &resetReporter]() {
        this->Makefile->IssueMessage(
          MessageType::WARNING,
          "HOMEPAGE_URL keyword not followed by a value or was followed "
          "by a value that expanded to nothing.");
        resetReporter();
      };
    } else if (i == 1 && args[i] == "__CMAKE_INJECTED_PROJECT_COMMAND__") {
      injectedProjectCommand = true;
    } else if (doing == DoingVersion) {
      doing = DoingLanguages;
      version = args[i];
      resetReporter();
    } else if (doing == DoingDescription) {
      doing = DoingLanguages;
      description = args[i];
      resetReporter();
    } else if (doing == DoingHomepage) {
      doing = DoingLanguages;
      homepage = args[i];
      resetReporter();
    } else // doing == DoingLanguages
    {
      languages.push_back(args[i]);
    }
  }

  if (missedValueReporter) {
    missedValueReporter();
  }

  if ((haveVersion || haveDescription || haveHomepage) && !haveLanguages &&
      !languages.empty()) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "project with VERSION, DESCRIPTION or HOMEPAGE_URL must "
      "use LANGUAGES before language names.");
    cmSystemTools::SetFatalErrorOccured();
    return true;
  }
  if (haveLanguages && languages.empty()) {
    languages.emplace_back("NONE");
  }

  cmPolicies::PolicyStatus cmp0048 =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0048);
  if (haveVersion) {
    // Set project VERSION variables to given values
    if (cmp0048 == cmPolicies::OLD || cmp0048 == cmPolicies::WARN) {
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        "VERSION not allowed unless CMP0048 is set to NEW");
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    cmsys::RegularExpression vx(
      R"(^([0-9]+(\.[0-9]+(\.[0-9]+(\.[0-9]+)?)?)?)?$)");
    if (!vx.find(version)) {
      std::string e = "VERSION \"" + version + "\" format invalid.";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
      cmSystemTools::SetFatalErrorOccured();
      return true;
    }

    std::string vs;
    const char* sep = "";
    char vb[4][64];
    unsigned int v[4] = { 0, 0, 0, 0 };
    int vc =
      sscanf(version.c_str(), "%u.%u.%u.%u", &v[0], &v[1], &v[2], &v[3]);
    for (int i = 0; i < 4; ++i) {
      if (i < vc) {
        sprintf(vb[i], "%u", v[i]);
        vs += sep;
        vs += vb[i];
        sep = ".";
      } else {
        vb[i][0] = 0;
      }
    }

    std::string vv;
    vv = projectName + "_VERSION";
    this->Makefile->AddDefinition("PROJECT_VERSION", vs.c_str());
    this->Makefile->AddDefinition(vv, vs.c_str());
    vv = projectName + "_VERSION_MAJOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MAJOR", vb[0]);
    this->Makefile->AddDefinition(vv, vb[0]);
    vv = projectName + "_VERSION_MINOR";
    this->Makefile->AddDefinition("PROJECT_VERSION_MINOR", vb[1]);
    this->Makefile->AddDefinition(vv, vb[1]);
    vv = projectName + "_VERSION_PATCH";
    this->Makefile->AddDefinition("PROJECT_VERSION_PATCH", vb[2]);
    this->Makefile->AddDefinition(vv, vb[2]);
    vv = projectName + "_VERSION_TWEAK";
    this->Makefile->AddDefinition("PROJECT_VERSION_TWEAK", vb[3]);
    this->Makefile->AddDefinition(vv, vb[3]);
    // Also, try set top level variables
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION", vs.c_str());
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MAJOR", vb[0]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_MINOR", vb[1]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_PATCH", vb[2]);
    TopLevelCMakeVarCondSet("CMAKE_PROJECT_VERSION_TWEAK", vb[3]);
  } else if (cmp0048 != cmPolicies::OLD) {
    // Set project VERSION variables to empty
    std::vector<std::string> vv;
    vv.emplace_back("PROJECT_VERSION");
    vv.emplace_back("PROJECT_VERSION_MAJOR");
    vv.emplace_back("PROJECT_VERSION_MINOR");
    vv.emplace_back("PROJECT_VERSION_PATCH");
    vv.emplace_back("PROJECT_VERSION_TWEAK");
    vv.push_back(projectName + "_VERSION");
    vv.push_back(projectName + "_VERSION_MAJOR");
    vv.push_back(projectName + "_VERSION_MINOR");
    vv.push_back(projectName + "_VERSION_PATCH");
    vv.push_back(projectName + "_VERSION_TWEAK");
    if (this->Makefile->IsRootMakefile()) {
      vv.emplace_back("CMAKE_PROJECT_VERSION");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MAJOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_MINOR");
      vv.emplace_back("CMAKE_PROJECT_VERSION_PATCH");
      vv.emplace_back("CMAKE_PROJECT_VERSION_TWEAK");
    }
    std::string vw;
    for (std::string const& i : vv) {
      const char* v = this->Makefile->GetDefinition(i);
      if (v && *v) {
        if (cmp0048 == cmPolicies::WARN) {
          if (!injectedProjectCommand) {
            vw += "\n  ";
            vw += i;
          }
        } else {
          this->Makefile->AddDefinition(i, "");
        }
      }
    }
    if (!vw.empty()) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0048)
        << "\nThe following variable(s) would be set to empty:" << vw;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
  }

  this->Makefile->AddDefinition("PROJECT_DESCRIPTION", description.c_str());
  this->Makefile->AddDefinition(projectName + "_DESCRIPTION",
                                description.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_DESCRIPTION", description.c_str());

  this->Makefile->AddDefinition("PROJECT_HOMEPAGE_URL", homepage.c_str());
  this->Makefile->AddDefinition(projectName + "_HOMEPAGE_URL",
                                homepage.c_str());
  TopLevelCMakeVarCondSet("CMAKE_PROJECT_HOMEPAGE_URL", homepage.c_str());

  if (languages.empty()) {
    // if no language is specified do c and c++
    languages.emplace_back("C");
    languages.emplace_back("CXX");
  }
  this->Makefile->EnableLanguage(languages, false);

  if (!this->IncludeByVariable("CMAKE_PROJECT_INCLUDE")) {
    return false;
  }

  if (!this->IncludeByVariable("CMAKE_PROJECT_" + projectName + "_INCLUDE")) {
    return false;
  }

  return true;
}